

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O2

uchar * stbi_zlib_compress(uchar *data,int data_len,int *out_len,int quality)

{
  byte *pbVar1;
  byte bVar2;
  bool bVar3;
  void **ppvVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  void *pvVar8;
  uchar *puVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  int itemsize;
  int itemsize_00;
  int iVar13;
  int extraout_EDX;
  int extraout_EDX_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar14;
  uchar *puVar15;
  uchar *extraout_RDX_01;
  undefined4 in_register_00000034;
  uchar *puVar16;
  int iVar17;
  void *__dest;
  long lVar18;
  ulong uVar19;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  uchar *local_a0;
  void *local_98;
  ulong local_90;
  ulong local_88;
  byte *local_80;
  uchar *local_78;
  uchar *local_70;
  uchar *local_68;
  int local_60;
  int local_5c;
  ulong local_58;
  int *local_50;
  size_t local_48;
  ulong local_40;
  void **local_38;
  
  local_88 = CONCAT44(in_register_00000034,data_len);
  local_a0 = (uchar *)0x0;
  local_78 = data;
  local_50 = out_len;
  pvVar8 = malloc(0x20000);
  if (pvVar8 == (void *)0x0) {
    return (uchar *)0x0;
  }
  local_58 = 5;
  if (5 < quality) {
    local_58 = (ulong)(uint)quality;
  }
  stbiw__sbgrowf(&local_a0,1,itemsize);
  iVar17 = *(int *)(local_a0 + -4);
  *(int *)(local_a0 + -4) = iVar17 + 1;
  local_a0[iVar17] = 'x';
  iVar12 = *(int *)(local_a0 + -4);
  iVar17 = iVar12 + 1;
  if (*(int *)(local_a0 + -8) <= iVar17) {
    stbiw__sbgrowf(&local_a0,1,itemsize_00);
    iVar12 = *(int *)(local_a0 + -4);
    iVar17 = iVar12 + 1;
  }
  *(int *)(local_a0 + -4) = iVar17;
  local_a0[iVar12] = '^';
  local_ac = 1;
  local_a8 = local_ac;
  puVar9 = stbiw__zlib_flushf(local_a0,&local_a8,(int *)&local_ac);
  local_a8 = local_a8 | 1 << ((byte)local_ac & 0x1f);
  local_ac = local_ac + 2;
  puVar9 = stbiw__zlib_flushf(puVar9,&local_a8,(int *)&local_ac);
  for (lVar10 = 0; lVar10 != 0x4000; lVar10 = lVar10 + 1) {
    *(undefined8 *)((long)pvVar8 + lVar10 * 8) = 0;
  }
  local_5c = (int)local_88 + -3;
  local_60 = (int)local_58 * 2;
  local_40 = local_58 & 0xffffffff;
  local_48 = local_40 * 8;
  uVar19 = 0;
  local_a0 = puVar9;
  local_98 = pvVar8;
  while (iVar17 = (int)uVar19, iVar17 < local_5c) {
    local_80 = local_78 + iVar17;
    local_68 = puVar9;
    uVar5 = stbiw__zhash(local_80);
    __dest = *(void **)((long)pvVar8 + (ulong)(uVar5 & 0x3fff) * 8);
    if (__dest == (void *)0x0) {
      lVar10 = 0;
    }
    else {
      lVar10 = (long)*(int *)((long)__dest + -4);
    }
    local_38 = (void **)((long)pvVar8 + (ulong)(uVar5 & 0x3fff) * 8);
    iVar12 = (int)local_88;
    if (lVar10 < 1) {
      lVar10 = 0;
    }
    local_a4 = 3;
    local_70 = (uchar *)0x0;
    uVar14 = extraout_RDX;
    local_90 = uVar19;
    for (lVar18 = 0; pbVar1 = local_80, iVar13 = (int)uVar14, lVar10 != lVar18; lVar18 = lVar18 + 1)
    {
      puVar9 = *(uchar **)((long)__dest + lVar18 * 8);
      if ((long)(iVar17 + -0x8000) < (long)puVar9 - (long)local_78) {
        uVar6 = stbiw__zlib_countm(puVar9,local_80,iVar12 - iVar17);
        uVar5 = local_a4;
        if ((int)local_a4 < (int)uVar6) {
          uVar5 = uVar6;
        }
        bVar3 = (int)local_a4 <= (int)uVar6;
        uVar14 = extraout_RDX_00;
        local_a4 = uVar5;
        if (bVar3) {
          local_70 = puVar9;
        }
      }
    }
    if (__dest == (void *)0x0) {
LAB_001040d9:
      ppvVar4 = local_38;
      stbiw__sbgrowf(local_38,8,iVar13);
      __dest = *ppvVar4;
      iVar17 = *(int *)((long)__dest + -4);
      iVar12 = iVar17 + 1;
    }
    else {
      iVar17 = *(int *)((long)__dest + -4);
      if (iVar17 == local_60) {
        memmove(__dest,(void *)(local_40 * 8 + (long)__dest),local_48);
        iVar17 = (int)local_58;
        *(int *)((long)__dest + -4) = iVar17;
        iVar13 = extraout_EDX;
      }
      iVar12 = iVar17 + 1;
      if (*(int *)((long)__dest + -8) <= iVar12) goto LAB_001040d9;
    }
    *(int *)((long)__dest + -4) = iVar12;
    *(byte **)((long)__dest + (long)iVar17 * 8) = pbVar1;
    if (local_70 == (uchar *)0x0) {
LAB_00104185:
      bVar2 = *local_80;
      if (bVar2 < 0x90) {
        iVar17 = stbiw__zlib_bitrev(bVar2 + 0x30,8);
        local_a8 = local_a8 | iVar17 << ((byte)local_ac & 0x1f);
        local_ac = local_ac + 8;
      }
      else {
        iVar17 = stbiw__zlib_bitrev(bVar2 | 0x100,9);
        local_a8 = local_a8 | iVar17 << ((byte)local_ac & 0x1f);
        local_ac = local_ac + 9;
      }
      iVar17 = (int)local_90;
      puVar9 = local_68;
      uVar5 = 1;
LAB_00104360:
      pvVar8 = local_98;
      puVar9 = stbiw__zlib_flushf(puVar9,&local_a8,(int *)&local_ac);
    }
    else {
      pbVar1 = local_80 + 1;
      uVar5 = stbiw__zhash(pbVar1);
      lVar10 = *(long *)((long)local_98 + (ulong)(uVar5 & 0x3fff) * 8);
      if (lVar10 == 0) {
        uVar5 = 0;
      }
      else {
        uVar5 = *(uint *)(lVar10 + -4);
      }
      uVar6 = (uint)local_90;
      iVar17 = ~uVar6 + (int)local_88;
      if ((int)uVar5 < 1) {
        uVar5 = 0;
      }
      for (uVar19 = 0; uVar5 != uVar19; uVar19 = uVar19 + 1) {
        puVar9 = *(uchar **)(lVar10 + uVar19 * 8);
        if (((long)(int)(uVar6 - 0x7fff) < (long)puVar9 - (long)local_78) &&
           (uVar7 = stbiw__zlib_countm(puVar9,pbVar1,iVar17), (int)local_a4 < (int)uVar7))
        goto LAB_00104185;
      }
      iVar12 = (int)local_80 - (int)local_70;
      if ((0x7fff < iVar12) || (0x102 < (int)local_a4)) {
        __assert_fail("d <= 32767 && best <= 258",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/footballhead[P]explorer-utils/stb_image_write/stb_image_write.h"
                      ,0x3b2,"unsigned char *stbi_zlib_compress(unsigned char *, int, int *, int)");
      }
      uVar19 = 0;
      do {
        uVar11 = uVar19;
        uVar19 = uVar11 + 1;
      } while ((int)(uint)stbi_zlib_compress::lengthc[uVar11 + 1] <= (int)local_a4);
      iVar17 = (int)(uVar11 + 1);
      if (uVar11 < 0x17) {
        iVar17 = stbiw__zlib_bitrev(iVar17,7);
        local_a8 = local_a8 | iVar17 << ((byte)local_ac & 0x1f);
        local_ac = local_ac + 7;
      }
      else {
        iVar17 = stbiw__zlib_bitrev(iVar17 + 0xa8,8);
        local_a8 = local_a8 | iVar17 << ((byte)local_ac & 0x1f);
        local_ac = local_ac + 8;
      }
      puVar9 = stbiw__zlib_flushf(local_68,&local_a8,(int *)&local_ac);
      uVar11 = uVar11 & 0xffffffff;
      if (0xffffffffffffffeb < uVar11 - 0x1c) {
        local_a8 = local_a8 |
                   local_a4 - stbi_zlib_compress::lengthc[uVar11] << ((byte)local_ac & 0x1f);
        local_ac = ""[uVar11] + local_ac;
        puVar9 = stbiw__zlib_flushf(puVar9,&local_a8,(int *)&local_ac);
      }
      uVar19 = 0xffffffffffffffff;
      do {
        lVar10 = uVar19 + 2;
        uVar19 = uVar19 + 1;
      } while ((int)(uint)stbi_zlib_compress::distc[lVar10] <= iVar12);
      iVar17 = stbiw__zlib_bitrev((int)uVar19,5);
      local_a8 = local_a8 | iVar17 << ((byte)local_ac & 0x1f);
      local_ac = local_ac + 5;
      puVar9 = stbiw__zlib_flushf(puVar9,&local_a8,(int *)&local_ac);
      iVar17 = (int)local_90;
      pvVar8 = local_98;
      uVar5 = local_a4;
      if (3 < uVar19) {
        local_a8 = local_a8 |
                   iVar12 - (uint)stbi_zlib_compress::distc[uVar19 & 0xffffffff] <<
                   ((byte)local_ac & 0x1f);
        local_ac = ""[uVar19 & 0xffffffff] + local_ac;
        goto LAB_00104360;
      }
    }
    uVar19 = (ulong)(uVar5 + iVar17);
  }
  lVar10 = (long)(int)local_88;
  local_a0 = puVar9;
  for (lVar18 = (long)iVar17; lVar18 < lVar10; lVar18 = lVar18 + 1) {
    bVar2 = local_78[lVar18];
    if (bVar2 < 0x90) {
      iVar17 = stbiw__zlib_bitrev(bVar2 + 0x30,8);
      local_a8 = local_a8 | iVar17 << ((byte)local_ac & 0x1f);
      local_ac = local_ac + 8;
    }
    else {
      iVar17 = stbiw__zlib_bitrev(bVar2 | 0x100,9);
      local_a8 = local_a8 | iVar17 << ((byte)local_ac & 0x1f);
      local_ac = local_ac + 9;
    }
    puVar9 = stbiw__zlib_flushf(puVar9,&local_a8,(int *)&local_ac);
  }
  local_a0 = puVar9;
  iVar17 = stbiw__zlib_bitrev(0,7);
  local_a8 = local_a8 | iVar17 << ((byte)local_ac & 0x1f);
  uVar5 = local_ac + 7;
  do {
    local_ac = uVar5;
    puVar9 = stbiw__zlib_flushf(puVar9,&local_a8,(int *)&local_ac);
    pvVar8 = local_98;
    uVar5 = local_ac + 1;
  } while (local_ac != 0);
  local_a0 = puVar9;
  for (lVar10 = 0; lVar10 != 0x4000; lVar10 = lVar10 + 1) {
    lVar18 = *(long *)((long)pvVar8 + lVar10 * 8);
    if (lVar18 != 0) {
      free((void *)(lVar18 + -8));
    }
  }
  free(pvVar8);
  puVar16 = (uchar *)((long)((ulong)(uint)((int)local_88 >> 0x1f) << 0x20 | local_88 & 0xffffffff) %
                      0x15b0 & 0xffffffff);
  uVar5 = 1;
  uVar6 = 0;
  puVar15 = puVar16;
  for (iVar17 = 0; iVar17 < (int)local_88; iVar17 = iVar17 + iVar12) {
    iVar12 = (int)puVar16;
    puVar15 = (uchar *)0x0;
    if (0 < iVar12) {
      puVar15 = puVar16;
    }
    for (puVar16 = (uchar *)0x0; puVar15 != puVar16; puVar16 = puVar16 + 1) {
      uVar5 = uVar5 + (local_78 + iVar17)[(long)puVar16];
      uVar6 = uVar6 + uVar5;
    }
    uVar5 = uVar5 % 0xfff1;
    puVar15 = (uchar *)((ulong)uVar6 % 0xfff1);
    puVar16 = (uchar *)0x15b0;
    uVar6 = (uint)puVar15;
  }
  if (puVar9 != (uchar *)0x0) {
    iVar12 = *(int *)(puVar9 + -4);
    iVar17 = iVar12 + 1;
    puVar15 = puVar9;
    if (iVar17 < *(int *)(puVar9 + -8)) goto LAB_00104511;
  }
  stbiw__sbgrowf(&local_a0,1,(int)puVar15);
  iVar12 = *(int *)(local_a0 + -4);
  iVar17 = iVar12 + 1;
  puVar9 = local_a0;
LAB_00104511:
  *(int *)(puVar9 + -4) = iVar17;
  puVar9[iVar12] = (uchar)(uVar6 >> 8);
  if (*(int *)(puVar9 + -8) <= *(int *)(puVar9 + -4) + 1) {
    stbiw__sbgrowf(&local_a0,1,(int)puVar9);
    puVar9 = extraout_RDX_01;
  }
  iVar13 = (int)puVar9;
  iVar17 = *(int *)(local_a0 + -4);
  *(int *)(local_a0 + -4) = iVar17 + 1;
  local_a0[iVar17] = (uchar)uVar6;
  iVar12 = *(int *)(local_a0 + -4);
  iVar17 = iVar12 + 1;
  if (*(int *)(local_a0 + -8) <= iVar17) {
    stbiw__sbgrowf(&local_a0,1,iVar13);
    iVar12 = *(int *)(local_a0 + -4);
    iVar17 = iVar12 + 1;
    iVar13 = extraout_EDX_00;
  }
  *(int *)(local_a0 + -4) = iVar17;
  local_a0[iVar12] = (uchar)(uVar5 >> 8);
  iVar12 = *(int *)(local_a0 + -4);
  iVar17 = iVar12 + 1;
  if (*(int *)(local_a0 + -8) <= iVar17) {
    stbiw__sbgrowf(&local_a0,1,iVar13);
    iVar12 = *(int *)(local_a0 + -4);
    iVar17 = iVar12 + 1;
  }
  *(int *)(local_a0 + -4) = iVar17;
  local_a0[iVar12] = (uchar)uVar5;
  iVar17 = *(int *)(local_a0 + -4);
  *local_50 = iVar17;
  puVar9 = (uchar *)memmove(local_a0 + -8,local_a0,(long)iVar17);
  return puVar9;
}

Assistant:

STBIWDEF unsigned char * stbi_zlib_compress(unsigned char *data, int data_len, int *out_len, int quality)
{
#ifdef STBIW_ZLIB_COMPRESS
   // user provided a zlib compress implementation, use that
   return STBIW_ZLIB_COMPRESS(data, data_len, out_len, quality);
#else // use builtin
   static unsigned short lengthc[] = { 3,4,5,6,7,8,9,10,11,13,15,17,19,23,27,31,35,43,51,59,67,83,99,115,131,163,195,227,258, 259 };
   static unsigned char  lengtheb[]= { 0,0,0,0,0,0,0, 0, 1, 1, 1, 1, 2, 2, 2, 2, 3, 3, 3, 3, 4, 4, 4,  4,  5,  5,  5,  5,  0 };
   static unsigned short distc[]   = { 1,2,3,4,5,7,9,13,17,25,33,49,65,97,129,193,257,385,513,769,1025,1537,2049,3073,4097,6145,8193,12289,16385,24577, 32768 };
   static unsigned char  disteb[]  = { 0,0,0,0,1,1,2,2,3,3,4,4,5,5,6,6,7,7,8,8,9,9,10,10,11,11,12,12,13,13 };
   unsigned int bitbuf=0;
   int i,j, bitcount=0;
   unsigned char *out = NULL;
   unsigned char ***hash_table = (unsigned char***) STBIW_MALLOC(stbiw__ZHASH * sizeof(unsigned char**));
   if (hash_table == NULL)
      return NULL;
   if (quality < 5) quality = 5;

   stbiw__sbpush(out, 0x78);   // DEFLATE 32K window
   stbiw__sbpush(out, 0x5e);   // FLEVEL = 1
   stbiw__zlib_add(1,1);  // BFINAL = 1
   stbiw__zlib_add(1,2);  // BTYPE = 1 -- fixed huffman

   for (i=0; i < stbiw__ZHASH; ++i)
      hash_table[i] = NULL;

   i=0;
   while (i < data_len-3) {
      // hash next 3 bytes of data to be compressed
      int h = stbiw__zhash(data+i)&(stbiw__ZHASH-1), best=3;
      unsigned char *bestloc = 0;
      unsigned char **hlist = hash_table[h];
      int n = stbiw__sbcount(hlist);
      for (j=0; j < n; ++j) {
         if (hlist[j]-data > i-32768) { // if entry lies within window
            int d = stbiw__zlib_countm(hlist[j], data+i, data_len-i);
            if (d >= best) { best=d; bestloc=hlist[j]; }
         }
      }
      // when hash table entry is too long, delete half the entries
      if (hash_table[h] && stbiw__sbn(hash_table[h]) == 2*quality) {
         STBIW_MEMMOVE(hash_table[h], hash_table[h]+quality, sizeof(hash_table[h][0])*quality);
         stbiw__sbn(hash_table[h]) = quality;
      }
      stbiw__sbpush(hash_table[h],data+i);

      if (bestloc) {
         // "lazy matching" - check match at *next* byte, and if it's better, do cur byte as literal
         h = stbiw__zhash(data+i+1)&(stbiw__ZHASH-1);
         hlist = hash_table[h];
         n = stbiw__sbcount(hlist);
         for (j=0; j < n; ++j) {
            if (hlist[j]-data > i-32767) {
               int e = stbiw__zlib_countm(hlist[j], data+i+1, data_len-i-1);
               if (e > best) { // if next match is better, bail on current match
                  bestloc = NULL;
                  break;
               }
            }
         }
      }

      if (bestloc) {
         int d = (int) (data+i - bestloc); // distance back
         STBIW_ASSERT(d <= 32767 && best <= 258);
         for (j=0; best > lengthc[j+1]-1; ++j);
         stbiw__zlib_huff(j+257);
         if (lengtheb[j]) stbiw__zlib_add(best - lengthc[j], lengtheb[j]);
         for (j=0; d > distc[j+1]-1; ++j);
         stbiw__zlib_add(stbiw__zlib_bitrev(j,5),5);
         if (disteb[j]) stbiw__zlib_add(d - distc[j], disteb[j]);
         i += best;
      } else {
         stbiw__zlib_huffb(data[i]);
         ++i;
      }
   }
   // write out final bytes
   for (;i < data_len; ++i)
      stbiw__zlib_huffb(data[i]);
   stbiw__zlib_huff(256); // end of block
   // pad with 0 bits to byte boundary
   while (bitcount)
      stbiw__zlib_add(0,1);

   for (i=0; i < stbiw__ZHASH; ++i)
      (void) stbiw__sbfree(hash_table[i]);
   STBIW_FREE(hash_table);

   {
      // compute adler32 on input
      unsigned int s1=1, s2=0;
      int blocklen = (int) (data_len % 5552);
      j=0;
      while (j < data_len) {
         for (i=0; i < blocklen; ++i) { s1 += data[j+i]; s2 += s1; }
         s1 %= 65521; s2 %= 65521;
         j += blocklen;
         blocklen = 5552;
      }
      stbiw__sbpush(out, STBIW_UCHAR(s2 >> 8));
      stbiw__sbpush(out, STBIW_UCHAR(s2));
      stbiw__sbpush(out, STBIW_UCHAR(s1 >> 8));
      stbiw__sbpush(out, STBIW_UCHAR(s1));
   }
   *out_len = stbiw__sbn(out);
   // make returned pointer freeable
   STBIW_MEMMOVE(stbiw__sbraw(out), out, *out_len);
   return (unsigned char *) stbiw__sbraw(out);
#endif // STBIW_ZLIB_COMPRESS
}